

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage7_high48_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i *in_XMM0_Qb;
  __m256i *in_YMM0_H;
  __m256i cospi_m48_m16;
  __m256i cospi_p48_p16;
  __m256i cospi_m16_p48;
  int32_t in_stack_000000f4;
  undefined1 in_stack_000000f8 [32];
  __m256i *in_stack_00000128;
  __m256i *in_stack_00000130;
  undefined1 in_stack_00000138 [32];
  undefined1 in_stack_00000158 [32];
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff30;
  
  uVar1 = (undefined4)in_stack_ffffffffffffff30;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_ffffffffffffff30 >> 0x10),
                     (int16_t)in_stack_ffffffffffffff30);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  btf_16_w16_avx2((__m256i)in_stack_00000158,(__m256i)in_stack_00000138,in_stack_00000130,
                  in_stack_00000128,(__m256i)in_stack_000000f8,in_stack_000000f4);
  btf_16_w16_avx2((__m256i)in_stack_00000158,(__m256i)in_stack_00000138,in_stack_00000130,
                  in_stack_00000128,(__m256i)in_stack_000000f8,in_stack_000000f4);
  btf_16_w16_avx2((__m256i)in_stack_00000158,(__m256i)in_stack_00000138,in_stack_00000130,
                  in_stack_00000128,(__m256i)in_stack_000000f8,in_stack_000000f4);
  btf_16_w16_avx2((__m256i)in_stack_00000158,(__m256i)in_stack_00000138,in_stack_00000130,
                  in_stack_00000128,(__m256i)in_stack_000000f8,in_stack_000000f4);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  return;
}

Assistant:

static inline void idct64_stage7_high48_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[19], &x[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[21], &x[26], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[32], &x[39]);
  btf_16_adds_subs_avx2(&x[33], &x[38]);
  btf_16_adds_subs_avx2(&x[34], &x[37]);
  btf_16_adds_subs_avx2(&x[35], &x[36]);
  btf_16_adds_subs_avx2(&x[47], &x[40]);
  btf_16_adds_subs_avx2(&x[46], &x[41]);
  btf_16_adds_subs_avx2(&x[45], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[43]);
  btf_16_adds_subs_avx2(&x[48], &x[55]);
  btf_16_adds_subs_avx2(&x[49], &x[54]);
  btf_16_adds_subs_avx2(&x[50], &x[53]);
  btf_16_adds_subs_avx2(&x[51], &x[52]);
  btf_16_adds_subs_avx2(&x[63], &x[56]);
  btf_16_adds_subs_avx2(&x[62], &x[57]);
  btf_16_adds_subs_avx2(&x[61], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[59]);
}